

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O2

void hookf(lua_State *L,lua_Debug *ar)

{
  TValue *pTVar1;
  int iVar2;
  
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->n = -5.13828271674896e-322;
  lua_rawget(L,-10000);
  iVar2 = lua_type(L,-1);
  if (iVar2 == 6) {
    lua_pushstring(L,hookf_hooknames_rel + *(int *)(hookf_hooknames_rel + (long)ar->event * 4));
    if ((long)ar->currentline < 0) {
      lua_pushnil(L);
    }
    else {
      lua_pushinteger(L,(long)ar->currentline);
    }
    lua_call(L,2,0);
    return;
  }
  return;
}

Assistant:

static void hookf(lua_State *L, lua_Debug *ar)
{
  static const char *const hooknames[] =
    {"call", "return", "line", "count", "tail return"};
  (L->top++)->u64 = KEY_HOOK;
  lua_rawget(L, LUA_REGISTRYINDEX);
  if (lua_isfunction(L, -1)) {
    lua_pushstring(L, hooknames[(int)ar->event]);
    if (ar->currentline >= 0)
      lua_pushinteger(L, ar->currentline);
    else lua_pushnil(L);
    lua_call(L, 2, 0);
  }
}